

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubAny
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  BasicHeapType BVar2;
  HeapType HVar3;
  HeapType *this_00;
  
  uVar1 = Random::upTo(this->rand,8);
  if (uVar1 == 1) {
    this_00 = (HeapType *)&HeapTypes::none;
  }
  else {
    if (uVar1 != 0) {
      HVar3 = pickSubEq(this,share);
      return (HeapType)HVar3.id;
    }
    this_00 = (HeapType *)&HeapTypes::any;
  }
  BVar2 = HeapType::getBasic(this_00,share);
  return (HeapType)(ulong)BVar2;
}

Assistant:

HeapType pickSubAny(Shareability share) {
    switch (rand.upTo(8)) {
      case 0:
        return HeapTypes::any.getBasic(share);
      case 1:
        return HeapTypes::none.getBasic(share);
      default:
        return pickSubEq(share);
    }
    WASM_UNREACHABLE("unexpected index");
  }